

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_cleanup(CURLM *multi_handle)

{
  SessionHandle *pSVar1;
  curl_hash *hash;
  SessionHandle *pSVar2;
  connectdata *conn;
  CURLMcode CVar3;
  
  CVar3 = CURLM_BAD_HANDLE;
  if ((multi_handle != (CURLM *)0x0) && (*multi_handle == 0xbab1e)) {
    *(undefined8 *)multi_handle = 0;
    while (conn = Curl_conncache_find_first_connection(*(conncache **)((long)multi_handle + 0x60)),
          conn != (connectdata *)0x0) {
      conn->data = *(SessionHandle **)((long)multi_handle + 0x68);
      Curl_disconnect(conn,false);
    }
    pSVar1 = *(SessionHandle **)((long)multi_handle + 0x68);
    if (pSVar1 != (SessionHandle *)0x0) {
      hash = *(curl_hash **)((long)multi_handle + 0x40);
      (pSVar1->dns).hostcache = hash;
      Curl_hostcache_clean(pSVar1,hash);
      Curl_close(*(SessionHandle **)((long)multi_handle + 0x68));
    }
    Curl_hash_destroy(*(curl_hash **)((long)multi_handle + 0x50));
    Curl_conncache_destroy(*(conncache **)((long)multi_handle + 0x60));
    CVar3 = CURLM_OK;
    Curl_llist_destroy(*(curl_llist **)((long)multi_handle + 0x20),(void *)0x0);
    Curl_llist_destroy(*(curl_llist **)((long)multi_handle + 0x28),(void *)0x0);
    pSVar1 = *(SessionHandle **)((long)multi_handle + 8);
    while (pSVar1 != (SessionHandle *)0x0) {
      pSVar2 = pSVar1->next;
      if ((pSVar1->dns).hostcachetype == HCACHE_MULTI) {
        Curl_hostcache_clean(pSVar1,(pSVar1->dns).hostcache);
        (pSVar1->dns).hostcache = (curl_hash *)0x0;
        (pSVar1->dns).hostcachetype = HCACHE_NONE;
      }
      (pSVar1->state).conn_cache = (conncache *)0x0;
      pSVar1->multi = (Curl_multi *)0x0;
      pSVar1 = pSVar2;
    }
    Curl_hash_destroy(*(curl_hash **)((long)multi_handle + 0x40));
    Curl_pipeline_set_site_blacklist((char **)0x0,(curl_llist **)((long)multi_handle + 0xa0));
    Curl_pipeline_set_server_blacklist((char **)0x0,(curl_llist **)((long)multi_handle + 0xa8));
    (*Curl_cfree)(multi_handle);
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_cleanup(CURLM *multi_handle)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  struct SessionHandle *nextdata;

  if(GOOD_MULTI_HANDLE(multi)) {
    bool restore_pipe = FALSE;
    SIGPIPE_VARIABLE(pipe_st);

    multi->type = 0; /* not good anymore */

    /* Close all the connections in the connection cache */
    close_all_connections(multi);

    if(multi->closure_handle) {
      sigpipe_ignore(multi->closure_handle, &pipe_st);
      restore_pipe = TRUE;

      multi->closure_handle->dns.hostcache = multi->hostcache;
      Curl_hostcache_clean(multi->closure_handle,
                           multi->closure_handle->dns.hostcache);

      Curl_close(multi->closure_handle);
    }

    Curl_hash_destroy(multi->sockhash);
    Curl_conncache_destroy(multi->conn_cache);
    Curl_llist_destroy(multi->msglist, NULL);
    Curl_llist_destroy(multi->pending, NULL);

    /* remove all easy handles */
    data = multi->easyp;
    while(data) {
      nextdata=data->next;
      if(data->dns.hostcachetype == HCACHE_MULTI) {
        /* clear out the usage of the shared DNS cache */
        Curl_hostcache_clean(data, data->dns.hostcache);
        data->dns.hostcache = NULL;
        data->dns.hostcachetype = HCACHE_NONE;
      }

      /* Clear the pointer to the connection cache */
      data->state.conn_cache = NULL;
      data->multi = NULL; /* clear the association */

      data = nextdata;
    }

    Curl_hash_destroy(multi->hostcache);

    /* Free the blacklists by setting them to NULL */
    Curl_pipeline_set_site_blacklist(NULL, &multi->pipelining_site_bl);
    Curl_pipeline_set_server_blacklist(NULL, &multi->pipelining_server_bl);

    free(multi);
    if(restore_pipe)
      sigpipe_restore(&pipe_st);

    return CURLM_OK;
  }
  else
    return CURLM_BAD_HANDLE;
}